

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_expectNoCallThatHappened_Test::testBody
          (TEST_MockCallTest_expectNoCallThatHappened_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockUnexpectedCallHappenedFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsList::MockExpectedCallsList(&local_80);
  local_80._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"lazy");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_80,0,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_a0,"lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)&local_70,test,&local_a0,&local_80);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"lazy");
  (*pMVar1->_vptr_MockSupport[4])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"lazy");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0xd0);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}